

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

string_validator __thiscall goodform::sub_form::string(sub_form *this)

{
  bool bVar1;
  undefined1 *puVar2;
  string_validator sVar3;
  string local_58;
  error_message local_38;
  
  bVar1 = is<std::__cxx11::string>(this->variant_);
  if (bVar1) {
    puVar2 = (undefined1 *)get<std::__cxx11::string>(this->variant_);
  }
  else {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"TYPE NOT STRING","");
    error_message::error_message(&local_38,&local_58);
    std::__cxx11::string::operator=((string *)this->error_,(string *)&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38.message_._M_dataplus._M_p != &local_38.message_.field_2) {
      operator_delete(local_38.message_._M_dataplus._M_p,
                      local_38.message_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    puVar2 = const_string_abi_cxx11_;
  }
  sVar3.value_ = (string *)puVar2;
  sVar3.error_ = this->error_;
  return sVar3;
}

Assistant:

string_validator sub_form::string()
  {
    if (!is<std::string>(this->variant_))
    {
      this->error_ = error_message("TYPE NOT STRING");
      return string_validator(const_string, this->error_);
    }
    else
    {
      return string_validator(get<std::string>(this->variant_), this->error_);
    }
  }